

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

int l_strcmp(TString *ls,TString *rs)

{
  undefined1 *puVar1;
  int iVar2;
  TString *pTVar3;
  TString *__s1;
  TString *pTVar4;
  TString *__s2;
  TString *pTVar5;
  
  if (ls->tt == '\x04') {
    pTVar5 = (TString *)(ulong)ls->shrlen;
  }
  else {
    pTVar5 = (ls->u).hnext;
  }
  __s1 = ls + 1;
  __s2 = rs + 1;
  if (rs->tt == '\x04') {
    pTVar4 = (TString *)(ulong)rs->shrlen;
  }
  else {
    pTVar4 = (rs->u).hnext;
  }
  while( true ) {
    iVar2 = strcoll((char *)__s1,(char *)__s2);
    if (iVar2 != 0) {
      return iVar2;
    }
    pTVar3 = (TString *)strlen((char *)__s1);
    if (pTVar3 == pTVar4) break;
    if (pTVar3 == pTVar5) {
      return -1;
    }
    puVar1 = (undefined1 *)((long)&pTVar3->next + 1);
    __s1 = (TString *)((long)&pTVar3->next + (long)((long)&__s1->next + 1));
    pTVar5 = (TString *)((long)pTVar5 - (long)puVar1);
    __s2 = (TString *)((long)&pTVar3->next + (long)((long)&__s2->next + 1));
    pTVar4 = (TString *)((long)pTVar4 - (long)puVar1);
  }
  return (uint)(pTVar4 != pTVar5);
}

Assistant:

static int l_strcmp(const TString *ls, const TString *rs) {
    const char *l = getstr(ls);
    size_t ll = tsslen(ls);
    const char *r = getstr(rs);
    size_t lr = tsslen(rs);
    for (;;) {  /* for each segment */
        int temp = strcoll(l, r);
        if (temp != 0)  /* not equal? */
            return temp;  /* done */
        else {  /* strings are equal up to a '\0' */
            size_t len = strlen(l);  /* index of first '\0' in both strings */
            if (len == lr)  /* 'rs' is finished? */
                return (len == ll) ? 0 : 1;  /* check 'ls' */
            else if (len == ll)  /* 'ls' is finished? */
                return -1;  /* 'ls' is smaller than 'rs' ('rs' is not finished) */
            /* both strings longer than 'len'; go on comparing after the '\0' */
            len++;
            l += len;
            ll -= len;
            r += len;
            lr -= len;
        }
    }
}